

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

ssize_t ossl_send(connectdata *conn,int sockindex,void *mem,size_t len,CURLcode *curlcode)

{
  uint uVar1;
  int err;
  uint *puVar2;
  ulong uVar3;
  char *pcVar4;
  size_t sVar5;
  size_t size;
  size_t size_00;
  Curl_easy *pCVar6;
  char error_buffer [256];
  
  pcVar4 = error_buffer;
  ERR_clear_error();
  sVar5 = 0x7fffffff;
  if (len < 0x7fffffff) {
    sVar5 = len;
  }
  uVar1 = SSL_write((SSL *)(conn->ssl[sockindex].backend)->handle,mem,(int)sVar5);
  if ((int)uVar1 < 1) {
    err = SSL_get_error((SSL *)(conn->ssl[sockindex].backend)->handle,uVar1);
    if (err - 2U < 2) {
      *curlcode = CURLE_AGAIN;
    }
    else {
      if (err == 1) {
        uVar3 = ERR_get_error();
        if ((((int)uVar3 == 0xa000080) && (conn->ssl[sockindex].state == ssl_connection_complete))
           && (conn->proxy_ssl[sockindex].state == ssl_connection_complete)) {
          Curl_ossl_version(error_buffer,0x78);
          pCVar6 = conn->data;
          pcVar4 = "Error: %s does not support double SSL tunneling.";
        }
        else {
          pCVar6 = conn->data;
          ossl_strerror(uVar3,error_buffer,size_00);
          pcVar4 = "SSL_write() error: %s";
        }
        Curl_failf(pCVar6,pcVar4,error_buffer);
      }
      else {
        if (err == 5) {
          puVar2 = (uint *)__errno_location();
          uVar1 = *puVar2;
          uVar3 = ERR_get_error();
          if (uVar3 == 0) {
            if (uVar1 == 0) {
              strncpy(error_buffer,"SSL_ERROR_SYSCALL",0x100);
              error_buffer[0xff] = '\0';
            }
            else {
              Curl_strerror(uVar1,error_buffer,0x100);
            }
          }
          else {
            ossl_strerror(uVar3,error_buffer,size);
          }
          pCVar6 = conn->data;
        }
        else {
          pCVar6 = conn->data;
          pcVar4 = SSL_ERROR_to_str(err);
          puVar2 = (uint *)__errno_location();
          uVar1 = *puVar2;
        }
        Curl_failf(pCVar6,"OpenSSL SSL_write: %s, errno %d",pcVar4,(ulong)uVar1);
      }
      *curlcode = CURLE_SEND_ERROR;
    }
    uVar3 = 0xffffffffffffffff;
  }
  else {
    *curlcode = CURLE_OK;
    uVar3 = (ulong)uVar1;
  }
  return uVar3;
}

Assistant:

static ssize_t ossl_send(struct connectdata *conn,
                         int sockindex,
                         const void *mem,
                         size_t len,
                         CURLcode *curlcode)
{
  /* SSL_write() is said to return 'int' while write() and send() returns
     'size_t' */
  int err;
  char error_buffer[256];
  unsigned long sslerror;
  int memlen;
  int rc;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];

  ERR_clear_error();

  memlen = (len > (size_t)INT_MAX) ? INT_MAX : (int)len;
  rc = SSL_write(BACKEND->handle, mem, memlen);

  if(rc <= 0) {
    err = SSL_get_error(BACKEND->handle, rc);

    switch(err) {
    case SSL_ERROR_WANT_READ:
    case SSL_ERROR_WANT_WRITE:
      /* The operation did not complete; the same TLS/SSL I/O function
         should be called again later. This is basically an EWOULDBLOCK
         equivalent. */
      *curlcode = CURLE_AGAIN;
      return -1;
    case SSL_ERROR_SYSCALL:
      {
        int sockerr = SOCKERRNO;
        sslerror = ERR_get_error();
        if(sslerror)
          ossl_strerror(sslerror, error_buffer, sizeof(error_buffer));
        else if(sockerr)
          Curl_strerror(sockerr, error_buffer, sizeof(error_buffer));
        else {
          strncpy(error_buffer, SSL_ERROR_to_str(err), sizeof(error_buffer));
          error_buffer[sizeof(error_buffer) - 1] = '\0';
        }
        failf(conn->data, OSSL_PACKAGE " SSL_write: %s, errno %d",
              error_buffer, sockerr);
        *curlcode = CURLE_SEND_ERROR;
        return -1;
      }
    case SSL_ERROR_SSL:
      /*  A failure in the SSL library occurred, usually a protocol error.
          The OpenSSL error queue contains more information on the error. */
      sslerror = ERR_get_error();
      if(ERR_GET_LIB(sslerror) == ERR_LIB_SSL &&
         ERR_GET_REASON(sslerror) == SSL_R_BIO_NOT_SET &&
         conn->ssl[sockindex].state == ssl_connection_complete &&
         conn->proxy_ssl[sockindex].state == ssl_connection_complete) {
        char ver[120];
        Curl_ossl_version(ver, 120);
        failf(conn->data, "Error: %s does not support double SSL tunneling.",
              ver);
      }
      else
        failf(conn->data, "SSL_write() error: %s",
              ossl_strerror(sslerror, error_buffer, sizeof(error_buffer)));
      *curlcode = CURLE_SEND_ERROR;
      return -1;
    }
    /* a true error */
    failf(conn->data, OSSL_PACKAGE " SSL_write: %s, errno %d",
          SSL_ERROR_to_str(err), SOCKERRNO);
    *curlcode = CURLE_SEND_ERROR;
    return -1;
  }
  *curlcode = CURLE_OK;
  return (ssize_t)rc; /* number of bytes */
}